

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

uint32_t __thiscall AmpIO::ReadSafetyAmpDisable(AmpIO *this)

{
  uint32_t uVar1;
  uint uVar2;
  ostream *poVar3;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x514c4131) {
    uVar1 = BoardIO::ReadStatus((BoardIO *)this);
    uVar2 = uVar1 >> 4 & 0xf;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "ReadSafetyAmpDisable not implemented for this hardware");
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint32_t AmpIO::ReadSafetyAmpDisable(void) const
{
    uint32_t val = 0;
    if (GetHardwareVersion() == QLA1_String) {
        // This field has been present in the Status register since Firmware Rev 3
        // (Firmware Rev 2 used register 11 and Firmware Rev 1 did not have this field)
        val = (ReadStatus()&0x000000F0) >> 4;
    }
    else {
        // This could be implemented by issuing NumMotors quadlet reads
        std::cerr << "ReadSafetyAmpDisable not implemented for this hardware" << std::endl;
    }
    return val;
}